

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int mbedtls_x509_crt_check_extended_key_usage
              (mbedtls_x509_crt *crt,char *usage_oid,size_t usage_len)

{
  size_t sVar1;
  int iVar2;
  mbedtls_x509_buf *cur_oid;
  mbedtls_asn1_sequence *pmVar3;
  
  iVar2 = 0;
  if ((crt->ext_types & 0x800) != 0) {
    for (pmVar3 = &crt->ext_key_usage; pmVar3 != (mbedtls_asn1_sequence *)0x0; pmVar3 = pmVar3->next
        ) {
      sVar1 = (pmVar3->buf).len;
      if (((sVar1 == usage_len) && (iVar2 = bcmp((pmVar3->buf).p,usage_oid,usage_len), iVar2 == 0))
         || ((sVar1 == 4 && (iVar2 = bcmp("U\x1d%",(pmVar3->buf).p,4), iVar2 == 0)))) {
        return 0;
      }
    }
    iVar2 = -0x2800;
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_crt_check_extended_key_usage( const mbedtls_x509_crt *crt,
                                       const char *usage_oid,
                                       size_t usage_len )
{
    const mbedtls_x509_sequence *cur;

    /* Extension is not mandatory, absent means no restriction */
    if( ( crt->ext_types & MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE ) == 0 )
        return( 0 );

    /*
     * Look for the requested usage (or wildcard ANY) in our list
     */
    for( cur = &crt->ext_key_usage; cur != NULL; cur = cur->next )
    {
        const mbedtls_x509_buf *cur_oid = &cur->buf;

        if( cur_oid->len == usage_len &&
            memcmp( cur_oid->p, usage_oid, usage_len ) == 0 )
        {
            return( 0 );
        }

        if( MBEDTLS_OID_CMP( MBEDTLS_OID_ANY_EXTENDED_KEY_USAGE, cur_oid ) == 0 )
            return( 0 );
    }

    return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );
}